

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O0

void __thiscall
pfederc::Parser::parseClassBody
          (Parser *this,Token *tokId,bool *err,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *attributes,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  initializer_list<pfederc::Position> __l;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> this_00;
  bool bVar1;
  ExprType EVar2;
  Token *pTVar3;
  type expr_00;
  pointer pEVar4;
  Position *__args_3;
  Position *pos;
  pointer local_128;
  pointer local_100;
  bool local_e1;
  allocator<pfederc::Position> local_d1;
  Position local_d0;
  Position *local_b8;
  size_type local_b0;
  vector<pfederc::Position,_std::allocator<pfederc::Position>_> local_a8;
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> local_48;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> local_40;
  undefined1 local_38 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *functions_local;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *attributes_local;
  bool *err_local;
  Token *tokId_local;
  Parser *this_local;
  
  expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)functions;
  do {
    while( true ) {
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator!=(pTVar3,TOK_STMT);
      local_e1 = false;
      if (bVar1) {
        pTVar3 = Lexer::getCurrentToken(this->lexer);
        local_e1 = Token::operator!=(pTVar3,TOK_EOF);
      }
      if (local_e1 == false) {
        bVar1 = expect(this,TOK_STMT);
        if (!bVar1) {
          local_90._6_2_ = 2;
          local_90._0_4_ = 0xc;
          pTVar3 = Lexer::getCurrentToken(this->lexer);
          __args_3 = Token::getPosition(pTVar3);
          pos = Token::getPosition(tokId);
          Position::Position(&local_d0,pos);
          local_b0 = 1;
          local_b8 = &local_d0;
          std::allocator<pfederc::Position>::allocator(&local_d1);
          __l._M_len = local_b0;
          __l._M_array = local_b8;
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                    (&local_a8,__l,&local_d1);
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                    ((Level *)(local_90 + 8),(SyntaxErrorCode *)(local_90 + 6),(Position *)local_90,
                     (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)__args_3);
          generateError((Parser *)(local_90 + 0x10),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_90 + 0x10));
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)(local_90 + 8));
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::~vector(&local_a8);
          std::allocator<pfederc::Position>::~allocator(&local_d1);
          *err = true;
        }
        return;
      }
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator==(pTVar3,TOK_EOL);
      if (!bVar1) break;
      Lexer::next(this->lexer);
    }
    parseExpression((Parser *)local_38,(Precedence)this);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_38);
    if (bVar1) {
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_38
                         );
      EVar2 = Expr::getType(pEVar4);
      this_00 = expr;
      if (EVar2 != EXPR_FUNC) goto LAB_00130e29;
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_38
                         );
      if (pEVar4 == (pointer)0x0) {
        local_100 = (pointer)0x0;
      }
      else {
        local_100 = (pointer)__dynamic_cast(pEVar4,&Expr::typeinfo,&FuncExpr::typeinfo,0);
      }
      std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>::
      unique_ptr<std::default_delete<pfederc::FuncExpr>,void>
                ((unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>> *)&local_40,
                 local_100);
      std::__cxx11::
      list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ::push_back((list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                   *)this_00._M_t.
                     super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl,
                  (value_type *)&local_40);
      std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                (&local_40);
    }
    else {
LAB_00130e29:
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_38);
      if (bVar1) {
        expr_00 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                             local_38);
        bVar1 = isBiOpExpr(expr_00,TOK_OP_DCL);
        if (bVar1) {
          pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                             ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                              local_38);
          if (pEVar4 == (pointer)0x0) {
            local_128 = (pointer)0x0;
          }
          else {
            local_128 = (pointer)__dynamic_cast(pEVar4,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
          }
          std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>::
          unique_ptr<std::default_delete<pfederc::BiOpExpr>,void>
                    ((unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>> *)
                     &local_48,local_128);
          std::__cxx11::
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          ::push_back(attributes,(value_type *)&local_48);
          std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                    (&local_48);
          goto LAB_00130f5e;
        }
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_38);
      if (bVar1) {
        local_60._6_2_ = 2;
        local_60._0_4_ = 0x15;
        pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_38);
        Expr::getPosition(pEVar4);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_60 + 8),(SyntaxErrorCode *)(local_60 + 6),(Position *)local_60);
        generateError((Parser *)(local_60 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_60 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_60 + 8));
      }
    }
LAB_00130f5e:
    bVar1 = expect(this,TOK_EOL);
    if (!bVar1) {
      local_78._6_2_ = 2;
      local_78._0_4_ = 0xf;
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      Token::getPosition(pTVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_78 + 8),(SyntaxErrorCode *)(local_78 + 6),(Position *)local_78);
      generateError((Parser *)(local_78 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_78 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_78 + 8));
      skipToStmtEol(this);
    }
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_38);
  } while( true );
}

Assistant:

void Parser::parseClassBody(const Token *const tokId, bool &err,
    std::list<std::unique_ptr<BiOpExpr>> &attributes,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {

  // classbody
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      functions.push_back(
        std::unique_ptr<FuncExpr>(
          dynamic_cast<FuncExpr*>(expr.release())));
    } else if (expr && isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
      attributes.push_back(
        std::unique_ptr<BiOpExpr>(
          dynamic_cast<BiOpExpr*>(expr.release())));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_CLASS_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
  // end of class body
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition(),
      std::vector<Position> { tokId->getPosition() }));
    err = true;
  }
}